

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O0

void __thiscall RealTrafficConnection::SetStatus(RealTrafficConnection *this,rtStatusTy s)

{
  logLevelTy lVar1;
  int in_ESI;
  long in_RDI;
  RealTrafficConnection *in_stack_00000008;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  lock_guard<std::recursive_mutex> *in_stack_ffffffffffffffa0;
  char *pcVar2;
  string local_48 [60];
  int local_c;
  
  local_c = in_ESI;
  std::lock_guard<std::recursive_mutex>::lock_guard
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *(int *)(in_RDI + 0x214) = local_c;
  lVar1 = DataRefs::GetLogLevel(&dataRefs);
  if ((int)lVar1 < 2) {
    if (local_c != 0) {
      GetStatusStr_abi_cxx11_(in_stack_00000008);
      pcVar2 = (char *)std::__cxx11::string::c_str();
    }
    else {
      pcVar2 = "Stopped";
    }
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
           ,0x5af,"SetStatus",logINFO,"RealTraffic network status changed to: %s",pcVar2);
    if (local_c != 0) {
      std::__cxx11::string::~string(local_48);
    }
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x21ba3a);
  return;
}

Assistant:

void RealTrafficConnection::SetStatus(rtStatusTy s)
{
    // consistent status decision
    std::lock_guard<std::recursive_mutex> lock(rtMutex);

    status = s;
    LOG_MSG(logINFO, MSG_RT_STATUS,
            s == RT_STATUS_NONE ? "Stopped" : GetStatusStr().c_str());
}